

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsRoberts_dns_uw.c
# Opt level: O0

int ewt(N_Vector y,N_Vector w,void *user_data)

{
  double dVar1;
  sunrealtype atol [3];
  sunrealtype rtol;
  sunrealtype ww;
  sunrealtype yy;
  int i;
  void *user_data_local;
  N_Vector w_local;
  N_Vector y_local;
  
  atol[0] = 1e-08;
  atol[1] = 1e-14;
  atol[2] = 1e-06;
  i = 1;
  while( true ) {
    if (3 < i) {
      return 0;
    }
    dVar1 = ABS(*(double *)(*(long *)((long)y->content + 0x10) + (long)(i + -1) * 8)) * 0.0001 +
            atol[i + -1];
    if (dVar1 <= 0.0) break;
    *(double *)(*(long *)((long)w->content + 0x10) + (long)(i + -1) * 8) = 1.0 / dVar1;
    i = i + 1;
  }
  return -1;
}

Assistant:

static int ewt(N_Vector y, N_Vector w, void* user_data)
{
  int i;
  sunrealtype yy, ww, rtol, atol[3];

  rtol    = RTOL;
  atol[0] = ATOL1;
  atol[1] = ATOL2;
  atol[2] = ATOL3;

  for (i = 1; i <= 3; i++)
  {
    yy = Ith(y, i);
    ww = rtol * ABS(yy) + atol[i - 1];
    if (ww <= 0.0) { return (-1); }
    Ith(w, i) = 1.0 / ww;
  }

  return (0);
}